

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::clara::detail::Parser::writeToStream(Parser *this,ostream *os)

{
  pointer *__return_storage_ptr__;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ParserRefImpl<Catch::clara::detail::Arg> *this_00;
  undefined4 extraout_var;
  size_type sVar5;
  unsigned_long *puVar6;
  Column *pCVar7;
  ostream *poVar8;
  Column local_1e0;
  Column local_1b0;
  Column local_180;
  Columns local_150;
  undefined1 local_138 [8];
  Columns row;
  HelpColumns *cols_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *__range3_1;
  unsigned_long local_f8;
  reference local_f0;
  HelpColumns *cols;
  iterator __end3;
  iterator __begin3;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  *__range3;
  size_t optWidth;
  size_t consoleWidth;
  vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_> rows
  ;
  Arg *arg;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *__range4;
  bool first;
  bool required;
  string local_58;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  Parser *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  ExeName::name_abi_cxx11_(&local_38,&this->m_exeName);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    poVar8 = ::std::operator<<(local_18,"usage:\n");
    poVar8 = ::std::operator<<(poVar8,"  ");
    ExeName::name_abi_cxx11_(&local_58,&this->m_exeName);
    poVar8 = ::std::operator<<(poVar8,(string *)&local_58);
    ::std::operator<<(poVar8," ");
    ::std::__cxx11::string::~string((string *)&local_58);
    bVar1 = true;
    bVar2 = true;
    __end4 = std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
             begin(&this->m_args);
    arg = (Arg *)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>
                 ::end(&this->m_args);
    while (bVar3 = __gnu_cxx::
                   operator==<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                             (&__end4,(__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                                       *)&arg), ((bVar3 ^ 0xffU) & 1) != 0) {
      this_00 = &__gnu_cxx::
                 __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                 ::operator*(&__end4)->super_ParserRefImpl<Catch::clara::detail::Arg>;
      if (bVar2) {
        bVar2 = false;
      }
      else {
        ::std::operator<<(local_18," ");
      }
      bVar3 = ParserRefImpl<Catch::clara::detail::Arg>::isOptional(this_00);
      if ((bVar3) && (bVar1)) {
        ::std::operator<<(local_18,"[");
        bVar1 = false;
      }
      poVar8 = ::std::operator<<(local_18,"<");
      __return_storage_ptr__ =
           &rows.
            super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      ParserRefImpl<Catch::clara::detail::Arg>::hint_abi_cxx11_
                ((string *)__return_storage_ptr__,this_00);
      poVar8 = ::std::operator<<(poVar8,(string *)__return_storage_ptr__);
      ::std::operator<<(poVar8,">");
      ::std::__cxx11::string::~string
                ((string *)
                 &rows.
                  super__Vector_base<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar4 = (*(this_00->super_ComposableParserImpl<Catch::clara::detail::Arg>).super_ParserBase.
                _vptr_ParserBase[4])();
      if (CONCAT44(extraout_var,iVar4) == 0) {
        ::std::operator<<(local_18," ... ");
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
      ::operator++(&__end4);
    }
    if (!bVar1) {
      ::std::operator<<(local_18,"]");
    }
    bVar2 = std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
            empty(&this->m_options);
    if (!bVar2) {
      ::std::operator<<(local_18," options");
    }
    poVar8 = ::std::operator<<(local_18,"\n\nwhere options are:");
    ::std::ostream::operator<<(poVar8,::std::endl<char,std::char_traits<char>>);
  }
  getHelpColumns((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                  *)&consoleWidth,this);
  optWidth = 0x50;
  __range3 = (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
              *)0x0;
  __end3 = std::
           vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
           ::begin((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                    *)&consoleWidth);
  cols = (HelpColumns *)
         std::
         vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
         ::end((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)&consoleWidth);
  while (bVar2 = __gnu_cxx::
                 operator==<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                           (&__end3,(__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                                     *)&cols), ((bVar2 ^ 0xffU) & 1) != 0) {
    local_f0 = __gnu_cxx::
               __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
               ::operator*(&__end3);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (&local_f0->left);
    local_f8 = sVar5 + 2;
    puVar6 = std::max<unsigned_long>((unsigned_long *)&__range3,&local_f8);
    __range3 = (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)*puVar6;
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
    ::operator++(&__end3);
  }
  __range3_1 = (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                *)(optWidth >> 1);
  puVar6 = std::min<unsigned_long>((unsigned_long *)&__range3,(unsigned_long *)&__range3_1);
  __range3 = (vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
              *)*puVar6;
  __end3_1 = std::
             vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
             ::begin((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                      *)&consoleWidth);
  cols_1 = (HelpColumns *)
           std::
           vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
           ::end((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
                  *)&consoleWidth);
  while (bVar2 = __gnu_cxx::
                 operator==<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                           (&__end3_1,
                            (__normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                             *)&cols_1), ((bVar2 ^ 0xffU) & 1) != 0) {
    row.m_columns.
    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
                  ::operator*(&__end3_1);
    TextFlow::Column::Column
              (&local_180,
               (string *)
               row.m_columns.
               super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pCVar7 = TextFlow::Column::width(&local_180,(size_t)__range3);
    pCVar7 = TextFlow::Column::indent(pCVar7,2);
    TextFlow::Spacer::Spacer((Spacer *)&local_1b0,4);
    TextFlow::Column::operator+(&local_150,pCVar7,&local_1b0);
    TextFlow::Column::Column
              (&local_1e0,
               (string *)
               &(row.m_columns.
                 super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->m_indent);
    pCVar7 = TextFlow::Column::width(&local_1e0,(optWidth - (long)__range3) - 7);
    TextFlow::Columns::operator+((Columns *)local_138,&local_150,pCVar7);
    TextFlow::Column::~Column(&local_1e0);
    TextFlow::Columns::~Columns(&local_150);
    TextFlow::Spacer::~Spacer((Spacer *)&local_1b0);
    TextFlow::Column::~Column(&local_180);
    poVar8 = TextFlow::operator<<(local_18,(Columns *)local_138);
    ::std::ostream::operator<<(poVar8,::std::endl<char,std::char_traits<char>>);
    TextFlow::Columns::~Columns((Columns *)local_138);
    __gnu_cxx::
    __normal_iterator<Catch::clara::detail::HelpColumns_*,_std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>_>
    ::operator++(&__end3_1);
  }
  std::vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
  ::~vector((vector<Catch::clara::detail::HelpColumns,_std::allocator<Catch::clara::detail::HelpColumns>_>
             *)&consoleWidth);
  return;
}

Assistant:

void writeToStream( std::ostream &os ) const {
            if (!m_exeName.name().empty()) {
                os << "usage:\n" << "  " << m_exeName.name() << " ";
                bool required = true, first = true;
                for( auto const &arg : m_args ) {
                    if (first)
                        first = false;
                    else
                        os << " ";
                    if( arg.isOptional() && required ) {
                        os << "[";
                        required = false;
                    }
                    os << "<" << arg.hint() << ">";
                    if( arg.cardinality() == 0 )
                        os << " ... ";
                }
                if( !required )
                    os << "]";
                if( !m_options.empty() )
                    os << " options";
                os << "\n\nwhere options are:" << std::endl;
            }

            auto rows = getHelpColumns();
            size_t consoleWidth = CATCH_CLARA_CONFIG_CONSOLE_WIDTH;
            size_t optWidth = 0;
            for( auto const &cols : rows )
                optWidth = (std::max)(optWidth, cols.left.size() + 2);

            optWidth = (std::min)(optWidth, consoleWidth/2);

            for( auto const &cols : rows ) {
                auto row =
                        TextFlow::Column( cols.left ).width( optWidth ).indent( 2 ) +
                        TextFlow::Spacer(4) +
                        TextFlow::Column( cols.right ).width( consoleWidth - 7 - optWidth );
                os << row << std::endl;
            }
        }